

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O3

void __thiscall
Vector::resize(Vector *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *ptr,
              size_t new_size)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  char cVar4;
  long lVar5;
  runtime_error *this_00;
  long *plVar6;
  long *plVar7;
  size_t i_1;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  ulong __new_size;
  MemoryLayout *pMVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  long lStack_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Typelib::Indirect::getIndirection();
  Typelib::Indirect::getIndirection();
  lVar5 = Typelib::Type::getSize();
  uVar8 = (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_80 = (**(code **)(*(long *)this + 200))(this,ptr);
  if ((this->element_layout).ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->element_layout).ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    Typelib::Type::getName_abi_cxx11_();
    std::operator+(&local_50,"could not compute layout for element type ",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar6;
    plVar7 = plVar6 + 2;
    if ((long *)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == plVar7) {
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      lStack_90 = plVar6[3];
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
    }
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::runtime_error::runtime_error(this_00,(string *)&local_a8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __new_size = lVar5 * new_size;
  pMVar10 = &this->element_layout;
  cVar4 = Typelib::MemoryLayout::isMemcpy();
  if (cVar4 == '\0') {
    local_88 = new_size;
    uVar9 = __new_size;
    if (new_size < local_80) {
      for (; uVar9 < uVar8; uVar9 = uVar9 + lVar5) {
        Typelib::destroy((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
      }
    }
    if ((ulong)((long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) < __new_size) {
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_a8,__new_size);
      local_78 = uVar8;
      if (__new_size < uVar8) {
        local_78 = __new_size;
      }
      if (uVar8 != 0) {
        uVar9 = 0;
        do {
          Typelib::init(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
          Typelib::copy(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar9,
                        (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
          Typelib::destroy((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
          uVar9 = uVar9 + lVar5;
        } while (uVar9 < local_78);
      }
      puVar1 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar1;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar3;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(ptr,__new_size);
    }
    if (local_80 < local_88) {
      for (; uVar8 < __new_size; uVar8 = uVar8 + lVar5) {
        Typelib::init((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar8,pMVar10);
      }
    }
    return;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(ptr,__new_size);
  return;
}

Assistant:

void Vector::resize(std::vector<uint8_t>* ptr, size_t new_size) const
{
    Type const& element_t = getIndirection();
    size_t element_size = getIndirection().getSize();

    size_t old_raw_size   = ptr->size();
    size_t old_size       = getElementCount(ptr);
    size_t new_raw_size   = new_size * element_size;

    if (!hasElementLayout())
        throw std::runtime_error("could not compute layout for element type " + element_t.getName() + ", cannot copy");

    if (isElementMemcpy())
    {
        ptr->resize(new_raw_size);
        return;
    }


    if (old_size > new_size)
    {
        // Need to destroy the elements that are at the end of the container
        for (size_t i = new_raw_size; i < old_raw_size; i += element_size)
            Typelib::destroy(&(*ptr)[i], element_layout);
    }


    if (ptr->capacity() >= new_raw_size)
        ptr->resize(new_raw_size);
    else
    {
        std::vector<uint8_t> new_buffer;
        new_buffer.resize(new_raw_size);
        size_t copy_raw_size = std::min(old_raw_size, new_raw_size);
        for (size_t i = 0; i < copy_raw_size; i += element_size)
        {
            Typelib::init(&new_buffer[i], element_layout);
            Typelib::copy(&new_buffer[i], &(*ptr)[i], element_layout);
            Typelib::destroy(&(*ptr)[i], element_layout);
        }
        ptr->swap(new_buffer);
    }

    if (old_size < new_size)
    {
        // Need to initialize the new elements at the end of the container
        for (size_t i = old_raw_size; i < new_raw_size; i += element_size)
            Typelib::init(&(*ptr)[i], element_layout);
    }
}